

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::copy
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imath_3_2::Matrix44<double>_> *this_00;
  
  this_00 = (TypedAttribute<Imath_3_2::Matrix44<double>_> *)operator_new(0x88);
  memset(this_00,0,0x88);
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}